

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::srgb_decode_texparameterIuiv
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_65;
  GLuint texture;
  GLuint local_60 [2];
  string local_58;
  string local_38;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_EXT_texture_sRGB_decode",(allocator<char> *)&local_58);
    bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      local_60[0] = 0x1100;
      local_60[1] = 0x1100;
      texture = 0x1234;
      glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
      glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT)."
                 ,&local_65);
      NegativeTestContext::beginSection(ctx,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x8a48,local_60);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
      glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
      return;
    }
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"GL_EXT_texture_sRGB_decode is not supported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
               ,0xfb5);
  }
  else {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"glTexParameterIuiv is not supported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
               ,0xfb2);
  }
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void srgb_decode_texparameterIuiv (NegativeTestContext& ctx)
{
	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError,"glTexParameterIuiv is not supported.");

	if (!ctx.isExtensionSupported("GL_EXT_texture_sRGB_decode"))
		TCU_THROW(NotSupportedError, "GL_EXT_texture_sRGB_decode is not supported.");

	GLuint	textureMode[]	= {GL_DEPTH_COMPONENT, GL_STENCIL_INDEX};
	GLuint	texture			= 0x1234;

	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	textureMode[0] = GL_DONT_CARE;
	textureMode[1] = GL_DONT_CARE;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT).");
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_SRGB_DECODE_EXT, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}